

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccs_test.cpp
# Opt level: O1

void __thiscall CcsTest_DefaultVals_Test::~CcsTest_DefaultVals_Test(CcsTest_DefaultVals_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CcsTest, DefaultVals) {
  CcsDomain ccs;
  CcsContext ctx = ccs.build();
  EXPECT_TRUE(ctx.getBool("nope", true));
  EXPECT_FALSE(ctx.getBool("nope", false));
  EXPECT_EQ(1, ctx.getInt("nope", 1));
  EXPECT_EQ("asdf", ctx.getString("nope", "asdf"));
  EXPECT_EQ(1.234, ctx.getDouble("nope", 1.234));
}